

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky_impl.h
# Opt level: O2

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::analyzePattern_preordered
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,CholMatrixType *ap,bool doLDLT)

{
  VectorI *this_00;
  VectorI *this_01;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  StorageIndex *pSVar4;
  Scalar *pSVar5;
  Index IVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong rows;
  ulong uVar12;
  ulong outer;
  undefined1 local_98 [8];
  InnerIterator it;
  aligned_stack_memory_handler<int> tags_stack_memory_destructor;
  
  puVar8 = local_98;
  uVar10 = ap->m_innerSize;
  rows = (ulong)(int)uVar10;
  SparseMatrix<double,_0,_int>::resize(&this->m_matrix,rows,rows);
  this_00 = &this->m_parent;
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,rows);
  this_01 = &this->m_nonZerosPerCol;
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,rows);
  if (rows >> 0x3e != 0) {
    internal::throw_std_bad_alloc();
  }
  uVar12 = (long)(uVar10 << 0x20) >> 0x1e;
  if (uVar12 < 0x20001) {
    puVar7 = local_98 + -(uVar12 + 0x1e & 0xfffffffffffffff0);
    puVar8 = puVar7;
  }
  else {
    puVar7 = (undefined1 *)internal::aligned_malloc(uVar12);
  }
  outer = 0;
  uVar12 = 0;
  it.m_end = (Index)puVar7;
  if (0 < (int)uVar10) {
    uVar12 = uVar10 & 0xffffffff;
  }
  for (; outer != uVar12; outer = outer + 1) {
    (this_00->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data[outer] =
         -1;
    iVar9 = (int)outer;
    *(int *)(puVar7 + outer * 4) = iVar9;
    (this_01->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data[outer] =
         0;
    *(undefined8 *)(puVar8 + -8) = 0x14f80a;
    SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
              ((InnerIterator *)local_98,
               &ap->super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>,outer);
    IVar6 = it.m_id;
    pSVar5 = it.m_values;
    for (; it.m_outer.m_value < IVar6; it.m_outer.m_value = it.m_outer.m_value + 1) {
      uVar10 = (ulong)*(int *)((long)pSVar5 + it.m_outer.m_value * 4);
      if ((long)uVar10 < (long)outer) {
        piVar2 = (this_00->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        piVar3 = (this_01->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        while (lVar11 = (long)(int)uVar10, outer != *(uint *)(puVar7 + lVar11 * 4)) {
          if (piVar2[lVar11] == -1) {
            piVar2[lVar11] = iVar9;
          }
          piVar1 = piVar3 + lVar11;
          *piVar1 = *piVar1 + 1;
          *(int *)(puVar7 + lVar11 * 4) = iVar9;
          uVar10 = (ulong)(uint)piVar2[lVar11];
        }
      }
    }
  }
  pSVar4 = (this->m_matrix).m_outerIndex;
  *pSVar4 = 0;
  piVar2 = (this->m_nonZerosPerCol).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  iVar9 = 0;
  for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    iVar9 = iVar9 + (uint)!doLDLT + piVar2[uVar10];
    pSVar4[uVar10 + 1] = iVar9;
  }
  iVar9 = pSVar4[rows];
  *(undefined8 *)(puVar8 + -8) = 0x14f8a4;
  SparseMatrix<double,_0,_int>::resizeNonZeros(&this->m_matrix,(long)iVar9);
  (this->
  super_SparseSolverBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ).m_isInitialized = true;
  this->m_info = Success;
  this->m_factorizationIsOk = false;
  this->m_analysisIsOk = true;
  *(undefined8 *)(puVar8 + -8) = 0x14f8ba;
  internal::aligned_stack_memory_handler<int>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<int> *)&it.m_end);
  return;
}

Assistant:

void SimplicialCholeskyBase<Derived>::analyzePattern_preordered(const CholMatrixType& ap, bool doLDLT)
{
  const StorageIndex size = StorageIndex(ap.rows());
  m_matrix.resize(size, size);
  m_parent.resize(size);
  m_nonZerosPerCol.resize(size);

  ei_declare_aligned_stack_constructed_variable(StorageIndex, tags, size, 0);

  for(StorageIndex k = 0; k < size; ++k)
  {
    /* L(k,:) pattern: all nodes reachable in etree from nz in A(0:k-1,k) */
    m_parent[k] = -1;             /* parent of k is not yet known */
    tags[k] = k;                  /* mark node k as visited */
    m_nonZerosPerCol[k] = 0;      /* count of nonzeros in column k of L */
    for(typename CholMatrixType::InnerIterator it(ap,k); it; ++it)
    {
      StorageIndex i = it.index();
      if(i < k)
      {
        /* follow path from i to root of etree, stop at flagged node */
        for(; tags[i] != k; i = m_parent[i])
        {
          /* find parent of i if not yet determined */
          if (m_parent[i] == -1)
            m_parent[i] = k;
          m_nonZerosPerCol[i]++;        /* L (k,i) is nonzero */
          tags[i] = k;                  /* mark i as visited */
        }
      }
    }
  }

  /* construct Lp index array from m_nonZerosPerCol column counts */
  StorageIndex* Lp = m_matrix.outerIndexPtr();
  Lp[0] = 0;
  for(StorageIndex k = 0; k < size; ++k)
    Lp[k+1] = Lp[k] + m_nonZerosPerCol[k] + (doLDLT ? 0 : 1);

  m_matrix.resizeNonZeros(Lp[size]);

  m_isInitialized     = true;
  m_info              = Success;
  m_analysisIsOk      = true;
  m_factorizationIsOk = false;
}